

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

size_t wabt::ReadS64Leb128(uint8_t *p,uint8_t *end,uint64_t *out_value)

{
  size_t sVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  if ((p < end) && (-1 < (long)(char)*p)) {
    uVar4 = ((long)(char)*p << 0x39) >> 0x39;
    sVar1 = 1;
  }
  else if ((p + 1 < end) && (lVar2 = (long)(char)p[1], -1 < lVar2)) {
    uVar4 = (long)((ulong)(*p & 0x7f) << 0x32 | lVar2 << 0x39) >> 0x32;
    sVar1 = 2;
  }
  else if ((p + 2 < end) && (lVar2 = (long)(char)p[2], -1 < lVar2)) {
    uVar4 = (long)((ulong)(*p & 0x7f) << 0x2b | (ulong)(p[1] & 0x7f) << 0x32 | lVar2 << 0x39) >>
            0x2b;
    sVar1 = 3;
  }
  else if ((p + 3 < end) && (lVar2 = (long)(char)p[3], -1 < lVar2)) {
    uVar4 = (long)((ulong)(*p & 0x7f) << 0x24 | (ulong)(p[1] & 0x7f) << 0x2b |
                   (ulong)(p[2] & 0x7f) << 0x32 | lVar2 << 0x39) >> 0x24;
    sVar1 = 4;
  }
  else if ((p + 4 < end) && (lVar2 = (long)(char)p[4], -1 < lVar2)) {
    auVar5 = ZEXT416(*(uint *)p) & _DAT_011d4680;
    auVar16 = pmovzxbq(in_XMM1,auVar5);
    auVar6._0_4_ = auVar5._0_4_ >> 0x10;
    auVar6._4_4_ = 0;
    auVar6._8_4_ = auVar5._8_4_ >> 0x10;
    auVar6._12_4_ = auVar5._12_4_ >> 0x10;
    auVar5 = pmovzxbq(auVar6,auVar6);
    auVar24._0_8_ = auVar16._0_8_ << 0x24;
    auVar24._8_8_ = auVar16._8_8_ << 0x24;
    auVar17._0_8_ = auVar16._0_8_ << 0x1d;
    auVar17._8_8_ = auVar16._8_8_ << 0x1d;
    auVar16 = pblendw(auVar17,auVar24,0xf0);
    auVar25._0_8_ = auVar5._0_8_ << 0x32;
    auVar25._8_8_ = auVar5._8_8_ << 0x32;
    auVar7._0_8_ = auVar5._0_8_ << 0x2b;
    auVar7._8_8_ = auVar5._8_8_ << 0x2b;
    auVar5 = pblendw(auVar7,auVar25,0xf0);
    uVar4 = (long)(SUB168(auVar5 | auVar16,8) | SUB168(auVar5 | auVar16,0) | lVar2 << 0x39) >> 0x1d;
    sVar1 = 5;
  }
  else if ((p + 5 < end) && (lVar2 = (long)(char)p[5], -1 < lVar2)) {
    auVar5 = ZEXT416(*(uint *)p) & _DAT_011d4680;
    auVar16 = pmovzxbq(in_XMM1,auVar5);
    auVar8._0_4_ = auVar5._0_4_ >> 0x10;
    auVar8._4_4_ = 0;
    auVar8._8_4_ = auVar5._8_4_ >> 0x10;
    auVar8._12_4_ = auVar5._12_4_ >> 0x10;
    auVar5 = pmovzxbq(auVar8,auVar8);
    auVar26._0_8_ = auVar16._0_8_ << 0x1d;
    auVar26._8_8_ = auVar16._8_8_ << 0x1d;
    auVar18._0_8_ = auVar16._0_8_ << 0x16;
    auVar18._8_8_ = auVar16._8_8_ << 0x16;
    auVar16 = pblendw(auVar18,auVar26,0xf0);
    auVar27._0_8_ = auVar5._0_8_ << 0x2b;
    auVar27._8_8_ = auVar5._8_8_ << 0x2b;
    auVar9._0_8_ = auVar5._0_8_ << 0x24;
    auVar9._8_8_ = auVar5._8_8_ << 0x24;
    auVar5 = pblendw(auVar9,auVar27,0xf0);
    uVar4 = (long)(SUB168(auVar5 | auVar16,8) | SUB168(auVar5 | auVar16,0) |
                  (ulong)(p[4] & 0x7f) << 0x32 | lVar2 << 0x39) >> 0x16;
    sVar1 = 6;
  }
  else if ((p + 6 < end) && (lVar2 = (long)(char)p[6], -1 < lVar2)) {
    auVar5 = ZEXT416(*(uint *)p) & _DAT_011d4680;
    auVar16 = pmovzxbq(in_XMM1,auVar5);
    auVar10._0_4_ = auVar5._0_4_ >> 0x10;
    auVar10._4_4_ = 0;
    auVar10._8_4_ = auVar5._8_4_ >> 0x10;
    auVar10._12_4_ = auVar5._12_4_ >> 0x10;
    auVar5 = pmovzxbq(auVar10,auVar10);
    auVar28._0_8_ = auVar16._0_8_ << 0x16;
    auVar28._8_8_ = auVar16._8_8_ << 0x16;
    auVar19._0_8_ = auVar16._0_8_ << 0xf;
    auVar19._8_8_ = auVar16._8_8_ << 0xf;
    auVar16 = pblendw(auVar19,auVar28,0xf0);
    auVar29._0_8_ = auVar5._0_8_ << 0x24;
    auVar29._8_8_ = auVar5._8_8_ << 0x24;
    auVar11._0_8_ = auVar5._0_8_ << 0x1d;
    auVar11._8_8_ = auVar5._8_8_ << 0x1d;
    auVar5 = pblendw(auVar11,auVar29,0xf0);
    uVar4 = (long)(SUB168(auVar5 | auVar16,8) | SUB168(auVar5 | auVar16,0) |
                  (ulong)(p[4] & 0x7f) << 0x2b | (ulong)(p[5] & 0x7f) << 0x32 | lVar2 << 0x39) >>
            0xf;
    sVar1 = 7;
  }
  else if ((p + 7 < end) && (lVar2 = (long)(char)p[7], -1 < lVar2)) {
    auVar5 = ZEXT416(*(uint *)p) & _DAT_011d4680;
    auVar16 = pmovzxbq(in_XMM1,auVar5);
    auVar12._0_4_ = auVar5._0_4_ >> 0x10;
    auVar12._4_4_ = 0;
    auVar12._8_4_ = auVar5._8_4_ >> 0x10;
    auVar12._12_4_ = auVar5._12_4_ >> 0x10;
    auVar5 = pmovzxbq(auVar12,auVar12);
    auVar30._0_8_ = auVar16._0_8_ << 0xf;
    auVar30._8_8_ = auVar16._8_8_ << 0xf;
    auVar20._0_8_ = auVar16._0_8_ << 8;
    auVar20._8_8_ = auVar16._8_8_ << 8;
    auVar16 = pblendw(auVar20,auVar30,0xf0);
    auVar31._0_8_ = auVar5._0_8_ << 0x1d;
    auVar31._8_8_ = auVar5._8_8_ << 0x1d;
    auVar13._0_8_ = auVar5._0_8_ << 0x16;
    auVar13._8_8_ = auVar5._8_8_ << 0x16;
    auVar5 = pblendw(auVar13,auVar31,0xf0);
    uVar4 = (long)(SUB168(auVar5 | auVar16,8) | SUB168(auVar5 | auVar16,0) |
                  (ulong)(p[4] & 0x7f) << 0x24 | lVar2 << 0x39 | (ulong)(p[6] & 0x7f) << 0x32 |
                  (ulong)(p[5] & 0x7f) << 0x2b) >> 8;
    sVar1 = 8;
  }
  else {
    if ((end <= p + 8) || (lVar2 = (long)(char)p[8], lVar2 < 0)) {
      if (p + 9 < end) {
        uVar3 = (uint)(char)p[9];
        if ((-1 < (int)uVar3) && ((uVar3 & 0x7e) == (-(uVar3 & 1) & 0x7e))) {
          auVar5 = ZEXT416(*(uint *)(p + 1)) & _DAT_011d4680;
          auVar22 = pmovzxbq(in_XMM1,auVar5);
          auVar16._0_4_ = auVar5._0_4_ >> 0x10;
          auVar16._4_4_ = 0;
          auVar16._8_4_ = auVar5._8_4_ >> 0x10;
          auVar16._12_4_ = auVar5._12_4_ >> 0x10;
          auVar5 = pmovzxbq(auVar16,auVar16);
          auVar34._0_8_ = auVar22._0_8_ << 0xe;
          auVar34._8_8_ = auVar22._8_8_ << 0xe;
          auVar23._0_8_ = auVar22._0_8_ << 7;
          auVar23._8_8_ = auVar22._8_8_ << 7;
          auVar16 = pblendw(auVar23,auVar34,0xf0);
          auVar35._0_8_ = auVar5._0_8_ << 0x1c;
          auVar35._8_8_ = auVar5._8_8_ << 0x1c;
          auVar22._0_8_ = auVar5._0_8_ << 0x15;
          auVar22._8_8_ = auVar5._8_8_ << 0x15;
          auVar5 = pblendw(auVar22,auVar35,0xf0);
          uVar4 = SUB168(auVar5 | auVar16,8) | SUB168(auVar5 | auVar16,0) |
                  (ulong)(*p & 0x7f) | (ulong)(p[5] & 0x7f) << 0x23 | (ulong)(p[6] & 0x7f) << 0x2a |
                  (ulong)(p[7] & 0x7f) << 0x31 | (ulong)uVar3 << 0x3f | (ulong)(p[8] & 0x7f) << 0x38
          ;
          sVar1 = 10;
          goto LAB_00f4a21b;
        }
      }
      return 0;
    }
    auVar5 = ZEXT416(*(uint *)(p + 1)) & _DAT_011d4680;
    auVar16 = pmovzxbq(in_XMM1,auVar5);
    auVar14._0_4_ = auVar5._0_4_ >> 0x10;
    auVar14._4_4_ = 0;
    auVar14._8_4_ = auVar5._8_4_ >> 0x10;
    auVar14._12_4_ = auVar5._12_4_ >> 0x10;
    auVar5 = pmovzxbq(auVar14,auVar14);
    auVar32._0_8_ = auVar16._0_8_ << 0xf;
    auVar32._8_8_ = auVar16._8_8_ << 0xf;
    auVar21._0_8_ = auVar16._0_8_ << 8;
    auVar21._8_8_ = auVar16._8_8_ << 8;
    auVar16 = pblendw(auVar21,auVar32,0xf0);
    auVar33._0_8_ = auVar5._0_8_ << 0x1d;
    auVar33._8_8_ = auVar5._8_8_ << 0x1d;
    auVar15._0_8_ = auVar5._0_8_ << 0x16;
    auVar15._8_8_ = auVar5._8_8_ << 0x16;
    auVar5 = pblendw(auVar15,auVar33,0xf0);
    uVar4 = (long)(SUB168(auVar5 | auVar16,8) | SUB168(auVar5 | auVar16,0) |
                  (ulong)(byte)(*p * '\x02') | (ulong)(p[5] & 0x7f) << 0x24 |
                  (ulong)(p[6] & 0x7f) << 0x2b | lVar2 << 0x39 | (ulong)(p[7] & 0x7f) << 0x32) >> 1;
    sVar1 = 9;
  }
LAB_00f4a21b:
  *out_value = uVar4;
  return sVar1;
}

Assistant:

size_t ReadS64Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint64_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    uint64_t result = LEB128_1(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 6);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    uint64_t result = LEB128_2(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 13);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    uint64_t result = LEB128_3(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 20);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    uint64_t result = LEB128_4(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 27);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    uint64_t result = LEB128_5(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 34);
    return 5;
  } else if (p + 5 < end && (p[5] & 0x80) == 0) {
    uint64_t result = LEB128_6(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 41);
    return 6;
  } else if (p + 6 < end && (p[6] & 0x80) == 0) {
    uint64_t result = LEB128_7(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 48);
    return 7;
  } else if (p + 7 < end && (p[7] & 0x80) == 0) {
    uint64_t result = LEB128_8(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 55);
    return 8;
  } else if (p + 8 < end && (p[8] & 0x80) == 0) {
    uint64_t result = LEB128_9(uint64_t);
    *out_value = SIGN_EXTEND(int64_t, result, 62);
    return 9;
  } else if (p + 9 < end && (p[9] & 0x80) == 0) {
    // The top bits should be a sign-extension of the sign bit.
    bool sign_bit_set = (p[9] & 0x1);
    int top_bits = p[9] & 0xfe;
    if ((sign_bit_set && top_bits != 0x7e) ||
        (!sign_bit_set && top_bits != 0)) {
      return 0;
    }
    uint64_t result = LEB128_10(uint64_t);
    *out_value = result;
    return 10;
  } else {
    // Past the end.
    return 0;
  }
}